

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_mident_metrics
          (Omega_h *this,Mesh *mesh,Int ent_dim,LOs *entities,Reals *v2m,bool has_degen)

{
  Mesh *mesh_00;
  LO nmetrics;
  Int IVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *pvVar2;
  Reals RVar3;
  Read<double> local_190;
  Read<int> local_180;
  Read<double> local_170;
  Read<int> local_160;
  Read<double> local_150;
  Read<int> local_140;
  Read<double> local_130;
  Read<int> local_120;
  Read<double> local_110;
  Read<int> local_100;
  Read<double> local_f0;
  Read<int> local_e0;
  Read<double> local_d0;
  Read<int> local_c0;
  Read<double> local_b0;
  Int local_a0;
  Int metrics_dim;
  allocator local_89;
  string local_88 [32];
  initializer_list<double> local_68;
  byte local_51;
  Reals *pRStack_50;
  bool has_degen_local;
  Reals *v2m_local;
  LOs *entities_local;
  Mesh *pMStack_38;
  Int ent_dim_local;
  Mesh *mesh_local;
  LOs *local_28;
  LOs *local_20;
  LOs *local_18;
  ulong local_10;
  
  if (((ulong)(entities->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((entities->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(entities->write_).shared_alloc_.alloc >> 3;
  }
  local_51 = has_degen;
  pRStack_50 = v2m;
  v2m_local = (Reals *)entities;
  entities_local._4_4_ = ent_dim;
  pMStack_38 = mesh;
  mesh_local = (Mesh *)this;
  local_28 = entities;
  local_20 = entities;
  local_18 = entities;
  if ((int)(local_10 >> 2) == 0) {
    std::initializer_list<double>::initializer_list(&local_68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"",&local_89);
    Read<double>::Read((Read<double> *)this,local_68,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pvVar2 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Read<double>::Read(&local_b0,v2m);
    IVar1 = get_metrics_dim(nmetrics,&local_b0);
    Read<double>::~Read(&local_b0);
    mesh_00 = pMStack_38;
    local_a0 = IVar1;
    if ((IVar1 == 3) && (entities_local._4_4_ == 3)) {
      Read<int>::Read(&local_c0,entities);
      Read<double>::Read(&local_d0,v2m);
      get_mident_metrics_tmpl<3,3>(this,mesh_00,&local_c0,&local_d0,(bool)(local_51 & 1));
      Read<double>::~Read(&local_d0);
      Read<int>::~Read(&local_c0);
      pvVar2 = extraout_RDX_00;
    }
    else if ((IVar1 == 3) && (entities_local._4_4_ == 1)) {
      Read<int>::Read(&local_e0,entities);
      Read<double>::Read(&local_f0,v2m);
      get_mident_metrics_tmpl<3,1>(this,mesh_00,&local_e0,&local_f0,(bool)(local_51 & 1));
      Read<double>::~Read(&local_f0);
      Read<int>::~Read(&local_e0);
      pvVar2 = extraout_RDX_01;
    }
    else if ((IVar1 == 2) && (entities_local._4_4_ == 2)) {
      Read<int>::Read(&local_100,entities);
      Read<double>::Read(&local_110,v2m);
      get_mident_metrics_tmpl<2,2>(this,mesh_00,&local_100,&local_110,(bool)(local_51 & 1));
      Read<double>::~Read(&local_110);
      Read<int>::~Read(&local_100);
      pvVar2 = extraout_RDX_02;
    }
    else if ((IVar1 == 2) && (entities_local._4_4_ == 1)) {
      Read<int>::Read(&local_120,entities);
      Read<double>::Read(&local_130,v2m);
      get_mident_metrics_tmpl<2,1>(this,mesh_00,&local_120,&local_130,(bool)(local_51 & 1));
      Read<double>::~Read(&local_130);
      Read<int>::~Read(&local_120);
      pvVar2 = extraout_RDX_03;
    }
    else if ((IVar1 == 1) && (entities_local._4_4_ == 3)) {
      Read<int>::Read(&local_140,entities);
      Read<double>::Read(&local_150,v2m);
      get_mident_metrics_tmpl<1,3>(this,mesh_00,&local_140,&local_150,(bool)(local_51 & 1));
      Read<double>::~Read(&local_150);
      Read<int>::~Read(&local_140);
      pvVar2 = extraout_RDX_04;
    }
    else if ((IVar1 == 1) && (entities_local._4_4_ == 2)) {
      Read<int>::Read(&local_160,entities);
      Read<double>::Read(&local_170,v2m);
      get_mident_metrics_tmpl<1,2>(this,mesh_00,&local_160,&local_170,(bool)(local_51 & 1));
      Read<double>::~Read(&local_170);
      Read<int>::~Read(&local_160);
      pvVar2 = extraout_RDX_05;
    }
    else {
      if ((IVar1 != 1) || (entities_local._4_4_ != 1)) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
             ,0x62);
      }
      Read<int>::Read(&local_180,entities);
      Read<double>::Read(&local_190,v2m);
      get_mident_metrics_tmpl<1,1>(this,mesh_00,&local_180,&local_190,(bool)(local_51 & 1));
      Read<double>::~Read(&local_190);
      Read<int>::~Read(&local_180);
      pvVar2 = extraout_RDX_06;
    }
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(
    Mesh* mesh, Int ent_dim, LOs entities, Reals v2m, bool has_degen) {
  if (entities.size() == 0) return Reals({});
  auto metrics_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (metrics_dim == 3 && ent_dim == 3) {
    return get_mident_metrics_tmpl<3, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 3 && ent_dim == 1) {
    return get_mident_metrics_tmpl<3, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 2) {
    return get_mident_metrics_tmpl<2, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 1) {
    return get_mident_metrics_tmpl<2, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 3) {
    return get_mident_metrics_tmpl<1, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 2) {
    return get_mident_metrics_tmpl<1, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 1) {
    return get_mident_metrics_tmpl<1, 1>(mesh, entities, v2m, has_degen);
  }
  OMEGA_H_NORETURN(Reals());
}